

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  long in_FS_OFFSET;
  allocator local_62;
  allocator local_61;
  string local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  LazyStat<Catch::GroupInfo>::operator=
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).currentGroupInfo,groupInfo);
  std::__cxx11::string::string((string *)&local_40,"Group",&local_61);
  XmlWriter::startElement(&this->m_xml,&local_40,Newline|Indent);
  std::__cxx11::string::string((string *)&local_60,"name",&local_62);
  XmlWriter::writeAttribute(&this->m_xml,&local_60,&groupInfo->name);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlReporter::testGroupStarting( GroupInfo const& groupInfo ) {
        StreamingReporterBase::testGroupStarting( groupInfo );
        m_xml.startElement( "Group" )
            .writeAttribute( "name", groupInfo.name );
    }